

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cc
# Opt level: O2

BitMap * re2c::BitMap::find(Go *g,State *x)

{
  bool bVar1;
  BitMap *pBVar2;
  BitMap **ppBVar3;
  
  ppBVar3 = &first;
  while( true ) {
    pBVar2 = *ppBVar3;
    if (pBVar2 == (BitMap *)0x0) {
      pBVar2 = (BitMap *)operator_new(0x20);
      pBVar2->go = g;
      pBVar2->on = x;
      pBVar2->next = first;
      pBVar2->i = 0;
      pBVar2->m = 0;
      first = pBVar2;
      return pBVar2;
    }
    bVar1 = matches(pBVar2->go->span,pBVar2->go->nSpans,pBVar2->on,g->span,g->nSpans,x);
    if (bVar1) break;
    ppBVar3 = &pBVar2->next;
  }
  return pBVar2;
}

Assistant:

const BitMap *BitMap::find(const Go *g, const State *x)
{
	for (const BitMap *b = first; b; b = b->next)
	{
		if (matches(b->go->span, b->go->nSpans, b->on, g->span, g->nSpans, x))
		{
			return b;
		}
	}

	return new BitMap(g, x);
}